

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSession.cpp
# Opt level: O2

void __thiscall net_uv::KCPSession::executeSend(KCPSession *this,char *data,uint32_t len)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 in_R9;
  
  if (len == 0 || data == (char *)0x0) {
    return;
  }
  if ((this->super_Session).m_isOnline == true) {
    iVar1 = (*(this->m_socket->super_Socket)._vptr_Socket[6])
                      (this->m_socket,data,len,0,0,in_R9,
                       CONCAT71((int7)((ulong)in_RAX >> 8),data == (char *)0x0));
    if ((char)iVar1 == '\0') {
      (*(this->super_Session)._vptr_Session[9])(this);
    }
  }
  free(data);
  return;
}

Assistant:

void KCPSession::executeSend(char* data, uint32_t len)
{
	if (data == NULL || len <= 0)
		return;

	if (isOnline())
	{
		if (!m_socket->send(data, len, NULL, NULL))
		{
			executeDisconnect();
		}
	}
	fc_free(data);
}